

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture2DView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  Vec3 *pVVar1;
  ReferenceParams *pRVar2;
  bool bVar3;
  long lVar4;
  int z;
  ulong uVar5;
  Vec3 *pVVar6;
  int y;
  Vec3 *pVVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float wy;
  float fVar11;
  float fVar12;
  float width;
  float height;
  Vec2 lodO;
  Vec2 clampedLod;
  Vec2 coordDxo;
  Vec2 lodBounds;
  Vec2 coordDy;
  Vec2 coordDx;
  Vec2 coord;
  Vec4 resPix;
  Vec4 refPix;
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBias;
  int local_1c0;
  undefined8 local_1b0;
  float local_1a4;
  float local_1a0;
  float local_19c;
  Vector<float,_2> local_198;
  Vec4 local_190;
  long local_180;
  Vector<float,_2> local_178;
  PixelBufferAccess *local_170;
  ulong local_168;
  Vector<float,_3> local_160;
  Vector<float,_3> local_150;
  Vector<int,_2> local_140;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  Vec2 local_124;
  undefined1 local_118 [20];
  float local_104 [2];
  float local_fc;
  Vec3 local_f8;
  float local_ec;
  float local_e8;
  float local_e4;
  Vec3 local_d8;
  float local_cc;
  float local_c8;
  float local_c4;
  Sampler *local_b8;
  Texture2DView *local_b0;
  ReferenceParams *local_a8;
  ConstPixelBufferAccess *local_a0;
  Vec3 *local_98;
  Vec3 *local_90;
  Vec3 *local_88;
  Vector<float,_2> local_80;
  float local_78 [8];
  Vec3 local_58;
  float fStack_4c;
  undefined8 local_48;
  Vector<float,_2> local_38;
  
  local_d8.m_data[0] = *texCoord;
  local_f8.m_data[0] = texCoord[1];
  local_d8.m_data[1] = texCoord[2];
  local_d8.m_data[2] = texCoord[4];
  local_cc = texCoord[6];
  local_f8.m_data[1] = texCoord[3];
  local_f8.m_data[2] = texCoord[5];
  local_ec = texCoord[7];
  if (src->m_numLevels < 1) {
    local_140.m_data[0] = 0;
    local_140.m_data[1] = 0;
  }
  else {
    local_140.m_data = *(int (*) [2])(src->m_levels->m_size).m_data;
  }
  width = (float)(result->m_size).m_data[0];
  height = (float)(result->m_size).m_data[1];
  local_58.m_data[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_58.m_data[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_58.m_data[2] = (sampleParams->super_RenderParams).w.m_data[2];
  fStack_4c = (sampleParams->super_RenderParams).w.m_data[3];
  local_48 = CONCAT44(local_58.m_data[1],local_58.m_data[2]);
  local_80.m_data[0] = 0.0;
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    local_80.m_data[0] = (sampleParams->super_RenderParams).bias;
  }
  local_78[0] = -1.0;
  local_78[1] = 0.0;
  local_78[2] = 1.0;
  local_78[3] = 0.0;
  local_78[4] = 0.0;
  local_78[5] = -1.0;
  local_78[6] = 0.0;
  local_78[7] = 1.0;
  local_118._16_4_ = -1.7146522e+38;
  local_170 = errorMask;
  local_e8 = local_f8.m_data[2];
  local_e4 = local_f8.m_data[1];
  local_c8 = local_d8.m_data[2];
  local_c4 = local_d8.m_data[1];
  local_a0 = reference;
  local_80.m_data[1] = local_80.m_data[0];
  tcu::RGBA::toVec((RGBA *)(local_118 + 0x10));
  tcu::clear(local_170,(Vec4 *)local_118);
  local_b8 = &sampleParams->sampler;
  local_1c0 = 0;
  uVar5 = 0;
  local_b0 = src;
  local_a8 = sampleParams;
  while ((int)uVar5 < (result->m_size).m_data[1]) {
    wy = (float)(int)uVar5 + 0.5;
    local_1a4 = wy / height;
    local_130 = height - wy;
    local_134 = 1.0 - local_1a4;
    local_168 = uVar5;
    for (y = 0; z = (int)uVar5, y < (result->m_size).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_118,(int)result,y,z);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(local_118 + 0x10),(int)local_a0,y,z);
      local_150.m_data[0] = local_104[0];
      local_150.m_data[1] = local_104[1];
      local_150.m_data[2] = local_fc;
      local_160.m_data[0] = (float)local_118._4_4_;
      local_160.m_data[1] = (float)local_118._8_4_;
      local_160.m_data[2] = (float)local_118._12_4_;
      tcu::operator-((tcu *)&local_124,&local_150,&local_160);
      tcu::abs<float,3>((tcu *)&local_190,(Vector<float,_3> *)&local_124);
      tcu::lessThanEqual<float,3>
                ((tcu *)&local_178,(Vector<float,_3> *)&local_190,nonShadowThreshold);
      bVar3 = tcu::boolAll<3>((Vector<bool,_3> *)&local_178);
      if (bVar3) {
        if (((float)local_118._0_4_ != (float)local_118._16_4_) ||
           (uVar5 = local_168, NAN((float)local_118._0_4_) || NAN((float)local_118._16_4_))) {
          fVar12 = (float)y + 0.5;
          fVar11 = fVar12 / width;
          bVar3 = 1.0 <= local_1a4 + fVar11;
          local_1a0 = wy;
          local_19c = fVar12;
          if (bVar3) {
            local_1a0 = local_130;
            local_19c = width - fVar12;
          }
          local_180 = CONCAT44(local_180._4_4_,fVar12);
          fVar12 = local_1a4;
          if (bVar3) {
            fVar11 = 1.0 - fVar11;
            fVar12 = local_134;
          }
          pVVar6 = &local_d8 + bVar3;
          pVVar1 = &local_58 + bVar3;
          fVar10 = projectedTriInterpolate(pVVar6,pVVar1,fVar11,fVar12);
          pVVar7 = &local_f8 + bVar3;
          local_124.m_data[1] = projectedTriInterpolate(pVVar7,pVVar1,fVar11,fVar12);
          local_124.m_data[0] = fVar10;
          fVar10 = triDerivateX(pVVar6,pVVar1,(float)local_180,width,fVar12);
          local_190.m_data[1] = triDerivateX(pVVar7,pVVar1,(float)local_180,width,fVar12);
          local_190.m_data[0] = fVar10;
          tcu::Vector<int,_2>::cast<float>(&local_140);
          tcu::operator*((Vector<float,_2> *)&local_190,(Vector<float,_2> *)&local_160);
          local_88 = pVVar6;
          fVar12 = triDerivateY(pVVar6,pVVar1,wy,height,fVar11);
          local_98 = pVVar1;
          local_90 = pVVar7;
          local_190.m_data[1] = triDerivateY(pVVar7,pVVar1,wy,height,fVar11);
          local_190.m_data[0] = fVar12;
          tcu::Vector<int,_2>::cast<float>(&local_140);
          tcu::operator*((Vector<float,_2> *)&local_190,&local_178);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&local_178,local_150.m_data[0],local_150.m_data[1],local_160.m_data[0],
                     local_160.m_data[1],lodPrec);
          lVar4 = 0;
          while (pVVar6 = local_88, pVVar1 = local_98, lVar4 != 4) {
            local_12c = local_78[lVar4 * 2] + local_19c;
            fVar12 = local_78[lVar4 * 2 + 1] + local_1a0;
            fVar10 = local_12c / width;
            local_128 = fVar12 / height;
            local_180 = lVar4;
            fVar11 = triDerivateX(local_88,local_98,local_12c,width,local_128);
            pVVar7 = local_90;
            local_198.m_data[1] = triDerivateX(local_90,pVVar1,local_12c,width,local_128);
            local_198.m_data[0] = fVar11;
            tcu::Vector<int,_2>::cast<float>(&local_140);
            tcu::operator*(&local_198,(Vector<float,_2> *)&local_1b0);
            fVar11 = triDerivateY(pVVar6,pVVar1,fVar12,height,fVar10);
            fVar12 = triDerivateY(pVVar7,pVVar1,fVar12,height,fVar10);
            local_1b0 = CONCAT44(fVar12,fVar11);
            tcu::Vector<int,_2>::cast<float>(&local_140);
            tcu::operator*((Vector<float,_2> *)&local_1b0,&local_38);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)&local_1b0,local_190.m_data[0],local_190.m_data[1],local_198.m_data[0]
                       ,local_198.m_data[1],lodPrec);
            fVar11 = (float)((ulong)local_1b0 >> 0x20);
            uVar8 = -(uint)(local_178.m_data[0] <= (float)local_1b0);
            uVar9 = -(uint)(fVar11 <= local_178.m_data[1]);
            local_178.m_data[0] =
                 (float)(~uVar8 & (uint)(float)local_1b0 | (uint)local_178.m_data[0] & uVar8);
            local_178.m_data[1] = (float)(~uVar9 & (uint)fVar11 | (uint)local_178.m_data[1] & uVar9)
            ;
            lVar4 = local_180 + 1;
          }
          tcu::operator+(&local_178,&local_80);
          pRVar2 = local_a8;
          local_1b0._0_4_ = local_a8->minLod;
          local_1b0._4_4_ = local_a8->maxLod;
          tcu::clampLodBounds((tcu *)&local_198,(Vec2 *)&local_190,(Vec2 *)&local_1b0,lodPrec);
          bVar3 = tcu::isTexCompareResultValid
                            (local_b0,local_b8,comparePrec,&local_124,(Vec2 *)&local_198,
                             (pRVar2->super_RenderParams).ref,(float)local_118._0_4_);
          uVar5 = local_168;
          if (!bVar3) {
            local_1b0 = CONCAT44(local_1b0._4_4_,0xff0000ff);
            tcu::RGBA::toVec((RGBA *)&local_1b0);
            tcu::PixelBufferAccess::setPixel(local_170,&local_190,y,(int)local_168,0);
            local_1c0 = local_1c0 + 1;
            uVar5 = local_168;
          }
        }
      }
      else {
        local_124.m_data[0] = -1.7014636e+38;
        tcu::RGBA::toVec((RGBA *)&local_124);
        tcu::PixelBufferAccess::setPixel(local_170,&local_190,y,z,0);
        local_1c0 = local_1c0 + 1;
      }
    }
    uVar5 = (ulong)(z + 1);
  }
  return local_1c0;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::Texture2DView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const tcu::IVec2	srcSize			= tcu::IVec2(src.getWidth(), src.getHeight());

	// Coordinates and lod per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec2	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec2	coordDx		= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
														triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy)) * srcSize.asFloat();
				const tcu::Vec2	coordDy		= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
														triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx)) * srcSize.asFloat();

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx.x(), coordDx.y(), coordDy.x(), coordDy.y(), lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec2	coordDxo	= tcu::Vec2(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
															triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo)) * srcSize.asFloat();
					const tcu::Vec2	coordDyo	= tcu::Vec2(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
															triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo)) * srcSize.asFloat();
					const tcu::Vec2	lodO		= tcu::computeLodBoundsFromDerivates(coordDxo.x(), coordDxo.y(), coordDyo.x(), coordDyo.y(), lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}